

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O0

void __thiscall
llvm::DWARFDebugLine::LineTable::dump(LineTable *this,raw_ostream *OS,DIDumpOptions DumpOptions)

{
  bool bVar1;
  reference this_00;
  Row *R;
  const_iterator __end2;
  const_iterator __begin2;
  RowVector *__range2;
  raw_ostream *OS_local;
  LineTable *this_local;
  
  Prologue::dump(&this->Prologue,OS,DumpOptions);
  raw_ostream::operator<<(OS,'\n');
  bVar1 = std::vector<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>::empty
                    (&this->Rows);
  if (!bVar1) {
    Row::dumpTableHeader(OS);
    __end2 = std::vector<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>::
             begin(&this->Rows);
    R = (Row *)std::vector<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>::
               end(&this->Rows);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_llvm::DWARFDebugLine::Row_*,_std::vector<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>_>
                                       *)&R), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_llvm::DWARFDebugLine::Row_*,_std::vector<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>_>
                ::operator*(&__end2);
      Row::dump(this_00,OS);
      __gnu_cxx::
      __normal_iterator<const_llvm::DWARFDebugLine::Row_*,_std::vector<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void DWARFDebugLine::LineTable::dump(raw_ostream &OS,
                                     DIDumpOptions DumpOptions) const {
  Prologue.dump(OS, DumpOptions);
  OS << '\n';

  if (!Rows.empty()) {
    Row::dumpTableHeader(OS);
    for (const Row &R : Rows) {
      R.dump(OS);
    }
  }
}